

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::ParsePolyLine(DXFImporter *this,LineReader *reader,FileData *output)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  int iVar1;
  pointer pBVar2;
  bool bVar3;
  uint uVar4;
  PolyLine *pPVar5;
  LineReader *reader_00;
  Logger *pLVar6;
  ulong uVar7;
  LineReader *this_02;
  uint i;
  uint uVar8;
  ulong uVar9;
  uint local_1ec;
  char *local_1c8 [4];
  undefined1 local_1a8 [376];
  
  pBVar2 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar5 = (PolyLine *)operator_new(0xa8);
  (pPVar5->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar5->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar5->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar5->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar5->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar5->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar5->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar5->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar5->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar5->flags = 0;
  (pPVar5->layer)._M_dataplus._M_p = (pointer)&(pPVar5->layer).field_2;
  (pPVar5->layer)._M_string_length = 0;
  uVar8 = 0;
  (pPVar5->layer).field_2._M_local_buf[0] = '\0';
  (pPVar5->desc)._M_dataplus._M_p = (pointer)&(pPVar5->desc).field_2;
  (pPVar5->desc)._M_string_length = 0;
  (pPVar5->desc).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<Assimp::DXF::PolyLine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::DXF::PolyLine,void>
            ((__shared_ptr<Assimp::DXF::PolyLine,(__gnu_cxx::_Lock_policy)2> *)local_1a8,pPVar5);
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
  ::emplace_back<std::shared_ptr<Assimp::DXF::PolyLine>>
            ((vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
              *)(pBVar2 + -1),(shared_ptr<Assimp::DXF::PolyLine> *)local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
  pPVar5 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].lines.
           super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &pPVar5->indices;
  local_1ec = 0;
  do {
    while( true ) {
      if ((1 < reader->end) || (bVar3 = DXF::LineReader::Is(reader,0,"ENDSEC"), bVar3))
      goto LAB_0040a3fa;
      bVar3 = DXF::LineReader::Is(reader,0,"VERTEX");
      if (bVar3) break;
      iVar1 = reader->groupcode;
      if (iVar1 == 8) {
        std::__cxx11::string::_M_assign((string *)&pPVar5->layer);
      }
      else if (iVar1 == 0x48) {
        local_1ec = DXF::LineReader::ValueAsSignedInt(reader);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,(ulong)local_1ec);
      }
      else if (iVar1 == 0x47) {
        uVar8 = DXF::LineReader::ValueAsSignedInt(reader);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  (&pPVar5->positions,(ulong)uVar8);
      }
      else if ((iVar1 == 0x46) && (pPVar5->flags == 0)) {
        uVar4 = DXF::LineReader::ValueAsSignedInt(reader);
        pPVar5->flags = uVar4;
      }
      DXF::LineReader::operator++(reader);
    }
    this_02 = reader;
    reader_00 = DXF::LineReader::operator++(reader);
    ParsePolyLineVertex((DXFImporter *)this_02,reader_00,pPVar5);
    bVar3 = DXF::LineReader::Is(reader,0,"SEQEND");
  } while (!bVar3);
LAB_0040a3fa:
  if ((uVar8 != 0) &&
     (((long)(pPVar5->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(pPVar5->positions).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) / 0xc != (ulong)uVar8)) {
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[43]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [43])"DXF: unexpected vertex count in polymesh: ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::operator<<((ostream *)local_1a8,", expected ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar6,local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  if ((pPVar5->flags & 0x40) == 0) {
    if (((pPVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (pPVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       ((pPVar5->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pPVar5->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      this_01 = &pPVar5->counts;
      uVar9 = (ulong)(pPVar5->flags & 1) +
              ((long)(pPVar5->positions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pPVar5->positions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,uVar9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_01,uVar9 >> 1);
      uVar9 = 0;
      uVar8 = 1;
      while( true ) {
        uVar7 = ((long)(pPVar5->positions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar5->positions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0xc;
        if (uVar7 >> 1 <= uVar9) break;
        local_1a8._0_4_ = uVar8 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)local_1a8);
        local_1a8._0_4_ = uVar8;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)local_1a8);
        local_1a8._0_4_ = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)local_1a8);
        uVar9 = (ulong)((int)uVar9 + 1);
        uVar8 = uVar8 + 2;
      }
      if ((pPVar5->flags & 1) != 0) {
        local_1a8._0_4_ = (int)uVar7 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)local_1a8);
        local_1a8._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)local_1a8);
        local_1a8._0_4_ = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)local_1a8);
      }
    }
  }
  else if (((ulong)(((long)(pPVar5->positions).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pPVar5->positions).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc) < 3) ||
          ((ulong)((long)(pPVar5->indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pPVar5->indices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start) < 9)) {
    pLVar6 = DefaultLogger::get();
    Logger::warn(pLVar6,"DXF: not enough vertices for polymesh; ignoring");
    std::
    vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
    ::pop_back(&(output->blocks).
                super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].lines);
  }
  else if ((local_1ec != 0) &&
          ((long)(pPVar5->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pPVar5->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2 != (ulong)local_1ec)) {
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[41]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [41])"DXF: unexpected face count in polymesh: ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::operator<<((ostream *)local_1a8,", expected ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar6,local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLine(DXF::LineReader& reader, DXF::FileData& output) {
    output.blocks.back().lines.push_back( std::shared_ptr<DXF::PolyLine>( new DXF::PolyLine() ) );
    DXF::PolyLine& line = *output.blocks.back().lines.back();

    unsigned int iguess = 0, vguess = 0;
    while( !reader.End() && !reader.Is(0,"ENDSEC")) {

        if (reader.Is(0,"VERTEX")) {
            ParsePolyLineVertex(++reader,line);
            if (reader.Is(0,"SEQEND")) {
                break;
            }
            continue;
        }

        switch(reader.GroupCode())
        {
        // flags --- important that we know whether it is a
        // polyface mesh or 'just' a line.
        case 70:
            if (!line.flags)    {
                line.flags = reader.ValueAsSignedInt();
            }
            break;

        // optional number of vertices
        case 71:
            vguess = reader.ValueAsSignedInt();
            line.positions.reserve(vguess);
            break;

        // optional number of faces
        case 72:
            iguess = reader.ValueAsSignedInt();
            line.indices.reserve(iguess);
            break;

        // 8 specifies the layer on which this line is placed on
        case 8:
            line.layer = reader.Value();
            break;
        }

        reader++;
    }

    //if (!(line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH))   {
    //  DefaultLogger::get()->warn((Formatter::format("DXF: polyline not currently supported: "),line.flags));
    //  output.blocks.back().lines.pop_back();
    //  return;
    //}

    if (vguess && line.positions.size() != vguess) {
        ASSIMP_LOG_WARN_F("DXF: unexpected vertex count in polymesh: ",
            line.positions.size(),", expected ", vguess );
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH ) {
        if (line.positions.size() < 3 || line.indices.size() < 3)   {
            ASSIMP_LOG_WARN("DXF: not enough vertices for polymesh; ignoring");
            output.blocks.back().lines.pop_back();
            return;
        }

        // if these numbers are wrong, parsing might have gone wild.
        // however, the docs state that applications are not required
        // to set the 71 and 72 fields, respectively, to valid values.
        // So just fire a warning.
        if (iguess && line.counts.size() != iguess) {
            ASSIMP_LOG_WARN_F( "DXF: unexpected face count in polymesh: ", line.counts.size(),", expected ", iguess );
        }
    }
    else if (!line.indices.size() && !line.counts.size()) {
        // a poly-line - so there are no indices yet.
        size_t guess = line.positions.size() + (line.flags & DXF_POLYLINE_FLAG_CLOSED ? 1 : 0);
        line.indices.reserve(guess);

        line.counts.reserve(guess/2);
        for (unsigned int i = 0; i < line.positions.size()/2; ++i) {
            line.indices.push_back(i*2);
            line.indices.push_back(i*2+1);
            line.counts.push_back(2);
        }

        // closed polyline?
        if (line.flags & DXF_POLYLINE_FLAG_CLOSED) {
            line.indices.push_back(static_cast<unsigned int>(line.positions.size()-1));
            line.indices.push_back(0);
            line.counts.push_back(2);
        }
    }
}